

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void vkt::sr::anon_unknown_0::eval_add_uvec2(ShaderEvalContext *c)

{
  ulong uVar1;
  int i;
  long lVar2;
  Vector<unsigned_int,_2> res_1;
  Vector<unsigned_int,_2> res;
  Vector<unsigned_int,_2> res_2;
  Vector<float,_2> res_3;
  float local_20 [2];
  ulong local_18;
  int local_8 [2];
  
  local_20[0] = c->in[0].m_data[3];
  local_20[1] = c->in[0].m_data[1];
  res.m_data[0] = 0;
  res.m_data[1] = 0;
  lVar2 = 0;
  do {
    res.m_data[lVar2] = (uint)(long)local_20[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  uVar1 = *(ulong *)c->in[1].m_data;
  local_18 = uVar1 << 0x20 | uVar1 >> 0x20;
  res_1.m_data[0] = 0;
  res_1.m_data[1] = 0;
  lVar2 = 0;
  do {
    res_1.m_data[lVar2] = (uint)(long)*(float *)((long)&local_18 + lVar2 * 4);
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  res_2.m_data[0] = 0;
  res_2.m_data[1] = 0;
  lVar2 = 0;
  do {
    res_2.m_data[lVar2] = res_1.m_data[lVar2] + res.m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  res_3.m_data[0] = 0.0;
  res_3.m_data[1] = 0.0;
  lVar2 = 0;
  do {
    res_3.m_data[lVar2] = (float)res_2.m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  local_8[0] = 1;
  local_8[1] = 2;
  lVar2 = 0;
  do {
    (c->color).m_data[local_8[lVar2]] = res_3.m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  return;
}

Assistant:

Vector<T, 2>			swizzle		(int a, int b) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); return Vector<T, 2>(m_data[a], m_data[b]); }